

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void chatra::parseInnerNode
               (ParserWorkingSet *ws,IErrorReceiver *errorReceiver,
               shared_ptr<chatra::StringTable> *sTable,Node *node,bool recursive)

{
  __node_base_ptr *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  Token *pTVar1;
  StatementAttributes *pSVar2;
  bool bVar3;
  bool bVar4;
  element_type *peVar5;
  AbortCompilingException *this_01;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_> *this_02
  ;
  string *message;
  reference this_03;
  reference ppTVar6;
  __shared_ptr *p_Var7;
  __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var8;
  reference ppTVar9;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *this_04;
  element_type *peVar10;
  element_type *peVar11;
  byte local_3db;
  byte local_3c1;
  shared_ptr<chatra::Node> *n_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *__range2_1
  ;
  pointer pbStack_330;
  pointer local_328;
  allocator local_319;
  string local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  allocator local_2d9;
  string local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  allocator local_299;
  string local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  allocator local_259;
  string local_258;
  byte local_233;
  byte local_232;
  allocator local_231;
  string local_230;
  byte local_20b;
  byte local_20a;
  allocator local_209;
  string local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  allocator local_1c1;
  string local_1c0;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_1a0;
  int local_194;
  Token **local_190;
  undefined1 local_188 [8];
  shared_ptr<chatra::Node> subNode;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_158;
  reference local_150;
  StatementPatternElement *e;
  const_iterator __end2;
  const_iterator __begin2;
  vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
  *__range2;
  const_iterator cStack_128;
  bool hasError;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  local_120;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  it;
  allocator local_f1;
  string local_f0;
  StatementAttributes *local_d0;
  StatementAttributes *attr;
  shared_ptr<chatra::Node> *n;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *__range1;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> outNodes;
  undefined1 local_80 [8];
  AnnotationMap aMap;
  ParserContext ct;
  bool recursive_local;
  Node *node_local;
  shared_ptr<chatra::StringTable> *sTable_local;
  IErrorReceiver *errorReceiver_local;
  ParserWorkingSet *ws_local;
  
  this = &aMap._M_h._M_single_bucket;
  ParserContext::ParserContext((ParserContext *)this,ws,errorReceiver,sTable);
  parseInnerAnnotations((AnnotationMap *)local_80,(ParserContext *)this,node);
  replaceSyntaxSugar((ParserContext *)this,(AnnotationMap *)local_80,node);
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
         &__range1);
  __end1 = std::
           vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
           begin(&node->blockNodes);
  n = (shared_ptr<chatra::Node> *)
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      end(&node->blockNodes);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                *)&n);
    if (!bVar3) {
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      operator=(&node->blockNodes,
                (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)&__range1);
      mapAnnotations((ParserContext *)&aMap._M_h._M_single_bucket,(AnnotationMap *)local_80,node);
      if (recursive) {
        __end2_1 = std::
                   vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ::begin(&node->blockNodes);
        n_1 = (shared_ptr<chatra::Node> *)
              std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::end(&node->blockNodes);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                                   *)&n_1), bVar3) {
          this_04 = &__gnu_cxx::
                     __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                     ::operator*(&__end2_1)->
                     super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
          peVar10 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(this_04);
          parseInnerNode(ws,errorReceiver,sTable,peVar10,true);
          peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)this_04);
          std::atomic<chatra::NodeState>::operator=(&peVar11->blockNodesState,Parsed);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
          ::operator++(&__end2_1);
        }
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               *)&__range1);
      std::
      unordered_map<const_void_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>_>
      ::~unordered_map((unordered_map<const_void_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>_>
                        *)local_80);
      return;
    }
    attr = (StatementAttributes *)
           __gnu_cxx::
           __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
           ::operator*(&__end1);
    peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)attr);
    local_d0 = getStAttr(peVar11->type);
    peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)attr);
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar11->line);
    if (bVar3) {
      peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)attr);
      peVar5 = std::__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<chatra::Line,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar11->line);
      if ((peVar5->containsError & 1U) != 0) {
        peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)attr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_f0,
                   "interpreter reached at the line which contains error on lexical analysis",
                   &local_f1);
        it._M_current = (Token **)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&it);
        ParserContext::errorAtLine
                  ((ParserContext *)&aMap._M_h._M_single_bucket,Error,&peVar11->line,&local_f0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&it);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&it);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        this_01 = (AbortCompilingException *)__cxa_allocate_exception(8);
        *this_01 = (AbortCompilingException)0x0;
        AbortCompilingException::AbortCompilingException(this_01);
        __cxa_throw(this_01,&AbortCompilingException::typeinfo,
                    AbortCompilingException::~AbortCompilingException);
      }
    }
    peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)attr);
    std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
    resize(&peVar11->subNodes,local_d0->subNodes);
    peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)attr);
    cStack_128 = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::cbegin
                           (&peVar11->tokens);
    local_120 = __gnu_cxx::
                __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                ::operator+(&stack0xfffffffffffffed8,local_d0->skipTokens);
    bVar3 = false;
    this_02 = &local_d0->pattern;
    __end2 = std::
             vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>
             ::begin(this_02);
    e = (StatementPatternElement *)
        std::
        vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>::
        end(this_02);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_chatra::StatementPatternElement_*,_std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>_>
                                       *)&e), bVar4) {
      local_150 = __gnu_cxx::
                  __normal_iterator<const_chatra::StatementPatternElement_*,_std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>_>
                  ::operator*(&__end2);
      peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)attr);
      local_158._M_current =
           (Token **)
           std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::cend
                     (&peVar11->tokens);
      bVar4 = __gnu_cxx::operator==(&local_120,&local_158);
      if (bVar4) {
        if ((local_150->required & 1U) != 0) {
          peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)attr);
          ppTVar9 = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::back
                              (&peVar11->tokens);
          pTVar1 = *ppTVar9;
          message = &local_150->errorMessage;
          subNode.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = &subNode.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00);
          ParserContext::errorAtNextToken
                    ((ParserContext *)&aMap._M_h._M_single_bucket,Error,pTVar1,message,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&subNode.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          bVar3 = true;
          break;
        }
      }
      else {
        peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)attr);
        local_190 = (Token **)
                    std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::cend
                              (&peVar11->tokens);
        extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  ((chatra *)local_188,(ParserContext *)&aMap._M_h._M_single_bucket,&local_120,
                   (__normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    )local_190,local_150);
        bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_188);
        if (bVar4) {
          if (local_150->subNodeIndex != 0xffffffffffffffff) {
            peVar11 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)attr);
            this_03 = std::
                      vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      ::operator[](&peVar11->subNodes,local_150->subNodeIndex);
            std::shared_ptr<chatra::Node>::operator=(this_03,(shared_ptr<chatra::Node> *)local_188);
          }
LAB_00272ec8:
          local_194 = 0;
        }
        else {
          if ((local_150->required & 1U) == 0) goto LAB_00272ec8;
          bVar3 = true;
          local_194 = 4;
        }
        std::shared_ptr<chatra::Node>::~shared_ptr((shared_ptr<chatra::Node> *)local_188);
        if (local_194 != 0) break;
      }
      __gnu_cxx::
      __normal_iterator<const_chatra::StatementPatternElement_*,_std::vector<chatra::StatementPatternElement,_std::allocator<chatra::StatementPatternElement>_>_>
      ::operator++(&__end2);
    }
    if (!bVar3) {
      peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)attr);
      local_1a0._M_current =
           (Token **)
           std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::cend
                     (&peVar11->tokens);
      bVar3 = __gnu_cxx::operator!=(&local_120,&local_1a0);
      if (bVar3) {
        ppTVar6 = __gnu_cxx::
                  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                  ::operator*(&local_120);
        pTVar1 = *ppTVar6;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c0,"extra token",&local_1c1);
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_1e8);
        ParserContext::errorAtToken
                  ((ParserContext *)&aMap._M_h._M_single_bucket,Error,pTVar1,&local_1c0,&local_1e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1e8);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      }
      else {
        peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)attr);
        pSVar2 = attr;
        local_20a = 0;
        local_20b = 0;
        local_3c1 = 0;
        if (peVar11->type == Def) {
          std::allocator<char>::allocator();
          local_20a = 1;
          std::__cxx11::string::string
                    ((string *)&local_208,"expected \".name(parameters)\"",&local_209);
          local_20b = 1;
          bVar3 = checkCombination((ParserContext *)&aMap._M_h._M_single_bucket,
                                   (shared_ptr<chatra::Node> *)pSVar2,4,5,&local_208);
          local_3c1 = bVar3 ^ 0xff;
        }
        if ((local_20b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_208);
        }
        if ((local_20a & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_209);
        }
        if ((local_3c1 & 1) == 0) {
          peVar11 = std::__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)attr);
          pSVar2 = attr;
          local_232 = 0;
          local_233 = 0;
          local_3db = 0;
          if (peVar11->type == Class) {
            std::allocator<char>::allocator();
            local_232 = 1;
            std::__cxx11::string::string
                      ((string *)&local_230,"expected \"extends base-classes,...\"",&local_231);
            local_233 = 1;
            bVar3 = checkCombination((ParserContext *)&aMap._M_h._M_single_bucket,
                                     (shared_ptr<chatra::Node> *)pSVar2,2,3,&local_230);
            local_3db = bVar3 ^ 0xff;
          }
          if ((local_233 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_230);
          }
          if ((local_232 & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)&local_231);
          }
          if ((local_3db & 1) == 0) {
            peVar11 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)attr);
            if (peVar11->type == Def) {
              peVar11 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)attr);
              p_Var7 = (__shared_ptr *)
                       std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::operator[](&peVar11->subNodes,6);
              bVar3 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
              if (bVar3) {
                peVar11 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)attr);
                bVar3 = std::
                        vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        ::empty(&peVar11->blockNodes);
                if (!bVar3) {
                  peVar11 = std::
                            __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)attr);
                  p_Var8 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)std::
                              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              ::operator[](&peVar11->blockNodes,0);
                  peVar11 = std::
                            __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->(p_Var8);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_258,"deleted method cannot have nested block",
                             &local_259);
                  local_278.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_278.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_278.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_278);
                  ParserContext::errorAtLine
                            ((ParserContext *)&aMap._M_h._M_single_bucket,Error,&peVar11->line,
                             &local_258,&local_278);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_278);
                  std::__cxx11::string::~string((string *)&local_258);
                  std::allocator<char>::~allocator((allocator<char> *)&local_259);
                  goto LAB_002739d7;
                }
              }
            }
            peVar11 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)attr);
            if (peVar11->type == Def) {
              peVar11 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)attr);
              p_Var7 = (__shared_ptr *)
                       std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::operator[](&peVar11->subNodes,6);
              bVar3 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
              if ((bVar3) &&
                 ((peVar11 = std::
                             __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)attr), peVar11->sid == Init ||
                  (peVar11 = std::
                             __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)attr), peVar11->sid == Deinit)))) {
                peVar11 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)attr);
                p_Var8 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)std::
                            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ::operator[](&peVar11->subNodes,6);
                peVar11 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->(p_Var8);
                ppTVar9 = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                          ::operator[](&peVar11->tokens,0);
                pTVar1 = *ppTVar9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_298,"\"init\" and \"deinit\" cannot be deleted method",
                           &local_299);
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_2b8);
                ParserContext::errorAtToken
                          ((ParserContext *)&aMap._M_h._M_single_bucket,Error,pTVar1,&local_298,
                           &local_2b8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2b8);
                std::__cxx11::string::~string((string *)&local_298);
                std::allocator<char>::~allocator((allocator<char> *)&local_299);
                goto LAB_002739d7;
              }
            }
            peVar11 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)attr);
            if (peVar11->type == Def) {
              peVar11 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)attr);
              p_Var7 = (__shared_ptr *)
                       std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::operator[](&peVar11->subNodes,0);
              bVar3 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
              if (bVar3) {
                peVar11 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)attr);
                p_Var8 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)std::
                            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ::operator[](&peVar11->subNodes,0);
                peVar11 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->(p_Var8);
                ppTVar9 = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                          ::operator[](&peVar11->tokens,0);
                pTVar1 = *ppTVar9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_2d8,
                           "static qualifier is reserved keyword, currently not working",&local_2d9)
                ;
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_2f8);
                ParserContext::errorAtToken
                          ((ParserContext *)&aMap._M_h._M_single_bucket,Warning,pTVar1,&local_2d8,
                           &local_2f8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2f8);
                std::__cxx11::string::~string((string *)&local_2d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
              }
            }
            peVar11 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)attr);
            if (peVar11->type == Class) {
              peVar11 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)attr);
              p_Var7 = (__shared_ptr *)
                       std::
                       vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ::operator[](&peVar11->subNodes,0);
              bVar3 = std::__shared_ptr::operator_cast_to_bool(p_Var7);
              if (bVar3) {
                peVar11 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)attr);
                p_Var8 = (__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)std::
                            vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            ::operator[](&peVar11->subNodes,0);
                peVar11 = std::
                          __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->(p_Var8);
                ppTVar9 = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                          ::operator[](&peVar11->tokens,0);
                pTVar1 = *ppTVar9;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_318,
                           "static qualifier is reserved keyword, currently not working",&local_319)
                ;
                __range2_1 = (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              *)0x0;
                pbStack_330 = (pointer)0x0;
                local_328 = (pointer)0x0;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range2_1);
                ParserContext::errorAtToken
                          ((ParserContext *)&aMap._M_h._M_single_bucket,Warning,pTVar1,&local_318,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range2_1);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&__range2_1);
                std::__cxx11::string::~string((string *)&local_318);
                std::allocator<char>::~allocator((allocator<char> *)&local_319);
              }
            }
            peVar11 = std::
                      __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)attr);
            if ((((peVar11->type != Def) ||
                 (bVar3 = qualifyDef((ParserContext *)&aMap._M_h._M_single_bucket,
                                     (shared_ptr<chatra::Node> *)attr), bVar3)) &&
                (std::
                 vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ::push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              *)&__range1,(value_type *)attr), !recursive)) &&
               ((peVar11 = std::
                           __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)attr), peVar11->type == Sync ||
                (peVar11 = std::
                           __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)attr), peVar11->type == IfGroup)))) {
              peVar10 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)attr);
              parseInnerNode(ws,errorReceiver,sTable,peVar10,false);
              peVar11 = std::
                        __shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<chatra::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)attr);
              std::atomic<chatra::NodeState>::operator=(&peVar11->blockNodesState,Parsed);
            }
          }
        }
      }
    }
LAB_002739d7:
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void parseInnerNode(ParserWorkingSet& ws, IErrorReceiver& errorReceiver,
		std::shared_ptr<StringTable>& sTable, Node* node, bool recursive) {

	chatra_assert(node->blockNodes.empty() || node->blockNodesState == NodeState::Structured);

	ParserContext ct(&ws, errorReceiver, sTable);

	auto aMap = parseInnerAnnotations(ct, node);
	replaceSyntaxSugar(ct, aMap, node);

	std::vector<std::shared_ptr<Node>> outNodes;
	for (auto& n : node->blockNodes) {
		auto& attr = getStAttr(n->type);

		if (n->line && n->line->containsError) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "interpreter reached at the line which contains error on lexical analysis", {});
			throw AbortCompilingException();
		}

		// Parse subNodes
		n->subNodes.resize(attr.subNodes);

		auto it = n->tokens.cbegin() + attr.skipTokens;
		bool hasError = false;
		for (auto& e : attr.pattern) {
			if (it == n->tokens.cend()) {
				if (!e.required)
					continue;
				chatra_assert(!e.errorMessage.empty());
				ct.errorAtNextToken(ErrorLevel::Error, *n->tokens.back(), e.errorMessage, {});
				hasError = true;
				break;
			}

			auto subNode = extractStatementPiece(ct, it, n->tokens.cend(), e);
			if (subNode) {
				if (e.subNodeIndex != SIZE_MAX) {
					chatra_assert(e.subNodeIndex < n->subNodes.size() && !n->subNodes[e.subNodeIndex]);
					n->subNodes[e.subNodeIndex] = std::move(subNode);
				}
			}
			else if (e.required) {
				hasError = true;
				break;
			}
		}
		if (hasError)
			continue;

		if (it != n->tokens.cend()) {
			ct.errorAtToken(ErrorLevel::Error, **it, "extra token", {});
			continue;
		}

		// Combination check
		if (n->type == NodeType::Def && !checkCombination(ct, n,
				SubNode::Def_Operator, SubNode::Def_OperatorParameter, "expected \".name(parameters)\""))
			continue;
		if (n->type == NodeType::Class && !checkCombination(ct, n,
				SubNode::Class_Extends, SubNode::Class_BaseClassList, "expected \"extends base-classes,...\""))
			continue;
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Delete] && !n->blockNodes.empty()) {
			ct.errorAtLine(ErrorLevel::Error, n->blockNodes[0]->line, "deleted method cannot have nested block", {});
			continue;
		}
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Delete] &&
				(n->sid == StringId::Init || n->sid == StringId::Deinit)) {
			ct.errorAtToken(ErrorLevel::Error, *n->subNodes[SubNode::Def_Delete]->tokens[0],
					R"("init" and "deinit" cannot be deleted method)", {});
			continue;
		}
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Static]) {
			ct.errorAtToken(ErrorLevel::Warning, *n->subNodes[SubNode::Def_Static]->tokens[0],
					"static qualifier is reserved keyword, currently not working", {});
		}
		if (n->type == NodeType::Class && n->subNodes[SubNode::Class_Static]) {
			ct.errorAtToken(ErrorLevel::Warning, *n->subNodes[SubNode::Class_Static]->tokens[0],
					"static qualifier is reserved keyword, currently not working", {});
		}

		// Additional process (set flags, etc)
		if (n->type == NodeType::Def && !qualifyDef(ct, n))
			continue;

		outNodes.push_back(n);

		if (!recursive) {
			if (n->type == NodeType::Sync || n->type == NodeType::IfGroup) {
				parseInnerNode(ws, errorReceiver, sTable, n.get(), false);
				n->blockNodesState = NodeState::Parsed;
			}
		}
	}

	node->blockNodes = outNodes;
	mapAnnotations(ct, aMap, node);

	if (recursive) {
		for (auto& n : node->blockNodes) {
			parseInnerNode(ws, errorReceiver, sTable, n.get(), true);
			n->blockNodesState = NodeState::Parsed;
		}
	}

	// node->blockNodesState = NodeState::Parsed;
}